

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec256.c
# Opt level: O2

void chacha20_core_256(Lib_IntVector_Intrinsics_vec256 *k,Lib_IntVector_Intrinsics_vec256 *ctx,
                      uint32_t ctr)

{
  Lib_IntVector_Intrinsics_vec256 alVar1;
  Lib_IntVector_Intrinsics_vec256 alVar2;
  Lib_IntVector_Intrinsics_vec256 *os;
  int iVar3;
  undefined1 auVar4 [32];
  
  memcpy(k,ctx,0x200);
  iVar3 = ctr << 3;
  auVar4._4_4_ = iVar3;
  auVar4._0_4_ = iVar3;
  auVar4._8_4_ = iVar3;
  auVar4._12_4_ = iVar3;
  auVar4._16_4_ = iVar3;
  auVar4._20_4_ = iVar3;
  auVar4._24_4_ = iVar3;
  auVar4._28_4_ = iVar3;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar4,(undefined1  [32])k[0xc]);
  k[0xc] = alVar1;
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])*ctx,(undefined1  [32])*k)
  ;
  *k = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[1],(undefined1  [32])k[1]);
  k[1] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[2],(undefined1  [32])k[2]);
  k[2] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[3],(undefined1  [32])k[3]);
  k[3] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[4],(undefined1  [32])k[4]);
  k[4] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[5],(undefined1  [32])k[5]);
  k[5] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[6],(undefined1  [32])k[6]);
  k[6] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[7],(undefined1  [32])k[7]);
  k[7] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[8],(undefined1  [32])k[8]);
  k[8] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[9],(undefined1  [32])k[9]);
  k[9] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[10],(undefined1  [32])k[10]);
  k[10] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xb],(undefined1  [32])k[0xb]);
  k[0xb] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xc],(undefined1  [32])k[0xc]);
  k[0xc] = alVar1;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xd],(undefined1  [32])k[0xd]);
  k[0xd] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xe],(undefined1  [32])k[0xe]);
  k[0xe] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xf],(undefined1  [32])k[0xf]);
  k[0xf] = alVar2;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar1,auVar4);
  k[0xc] = alVar1;
  return;
}

Assistant:

static inline void
chacha20_core_256(
  Lib_IntVector_Intrinsics_vec256 *k,
  Lib_IntVector_Intrinsics_vec256 *ctx,
  uint32_t ctr
)
{
  memcpy(k, ctx, 16U * sizeof (Lib_IntVector_Intrinsics_vec256));
  uint32_t ctr_u32 = 8U * ctr;
  Lib_IntVector_Intrinsics_vec256 cv = Lib_IntVector_Intrinsics_vec256_load32(ctr_u32);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    Lib_IntVector_Intrinsics_vec256 *os = k;
    Lib_IntVector_Intrinsics_vec256 x = Lib_IntVector_Intrinsics_vec256_add32(k[i], ctx[i]);
    os[i] = x;);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
}